

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall args::CompletionFlag::Get_abi_cxx11_(CompletionFlag *this)

{
  string *in_RSI;
  string *in_RDI;
  allocator local_31;
  string local_30 [32];
  string *array;
  
  array = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\n",&local_31);
  detail::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)array,in_RSI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string Get() noexcept
            {
                return detail::Join(reply, "\n");
            }